

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

FederateState * __thiscall
helics::CommonCore::getHandleFederate(CommonCore *this,InterfaceHandle handle)

{
  shared_mutex *__rwlock;
  pointer puVar1;
  LocalFederateId LVar2;
  _Head_base<0UL,_helics::FederateState_*,_false> _Var3;
  handle feds;
  unique_lock<std::shared_mutex> local_30;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  LVar2 = HandleManager::getLocalFedID(&(this->handles).m_obj,handle);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (LVar2.fid == -2000000000) {
    _Var3._M_head_impl = (FederateState *)0x0;
  }
  else {
    local_30._M_device = &(this->federates).m_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&local_30);
    local_30._M_owns = true;
    puVar1 = (this->federates).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)LVar2.fid <
        (ulong)((long)(this->federates).m_obj.dataStorage.
                      super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
      _Var3._M_head_impl = *(FederateState **)&puVar1[LVar2.fid]._M_t;
    }
    else {
      _Var3._M_head_impl = (FederateState *)0x0;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  }
  return (FederateState *)
         (_Tuple_impl<0UL,_helics::FederateState_*,_std::default_delete<helics::FederateState>_>)
         _Var3._M_head_impl;
}

Assistant:

FederateState* CommonCore::getHandleFederate(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        auto feds = federates.lock();
        return (*feds)[local_fed_id.baseValue()];
    }

    return nullptr;
}